

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXCompiler.cpp
# Opt level: O0

HRESULT __thiscall
Diligent::anon_unknown_0::DxcIncludeHandlerImpl::LoadSource
          (DxcIncludeHandlerImpl *this,LPCWSTR pFilename,IDxcBlob **ppIncludeSource)

{
  IShaderSourceInputStreamFactory *pIVar1;
  wchar_t wVar2;
  undefined *puVar3;
  ulong uVar4;
  undefined1 *puVar5;
  char *pcVar6;
  undefined8 uVar7;
  IFileStream **ppIVar8;
  IFileStream *pIVar9;
  DataBlobImpl *pDVar10;
  IDxcLibrary *pIVar11;
  void *pvVar12;
  size_t sVar13;
  char (*Args_2) [2];
  IDxcBlobEncoding *pIVar14;
  void **ppvVar15;
  undefined1 local_b8 [8];
  string _msg;
  HRESULT hr;
  CComPtr<IDxcBlobEncoding> pSourceBlob;
  RefCntAutoPtr<Diligent::DataBlobImpl> pFileData;
  RefCntAutoPtr<Diligent::IFileStream> local_70;
  RefCntAutoPtr<Diligent::IFileStream> pSourceStream;
  ulong local_60;
  size_t i;
  undefined1 local_48 [8];
  String fileName;
  IDxcBlob **ppIncludeSource_local;
  LPCWSTR pFilename_local;
  DxcIncludeHandlerImpl *this_local;
  
  if (pFilename == (LPCWSTR)0x0) {
    return -0x7ff8ffa9;
  }
  if (ppIncludeSource != (IDxcBlob **)0x0) {
    *ppIncludeSource = (IDxcBlob *)0x0;
    fileName.field_2._8_8_ = ppIncludeSource;
    std::__cxx11::string::string((string *)local_48);
    wcslen(pFilename);
    std::__cxx11::string::resize((ulong)local_48);
    for (local_60 = 0; uVar4 = std::__cxx11::string::size(), local_60 < uVar4;
        local_60 = local_60 + 1) {
      wVar2 = pFilename[local_60];
      puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_48);
      *puVar5 = (char)wVar2;
    }
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      uVar4 = std::__cxx11::string::size();
      if (((2 < uVar4) &&
          (pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_48), *pcVar6 == '.')) &&
         ((pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_48), *pcVar6 == '\\' ||
          (pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_48), *pcVar6 == '/')))) {
        std::__cxx11::string::erase((ulong)local_48,0);
      }
      RefCntAutoPtr<Diligent::IFileStream>::RefCntAutoPtr(&local_70);
      pIVar1 = this->m_pStreamFactory;
      uVar7 = std::__cxx11::string::c_str();
      RefCntAutoPtr<Diligent::IFileStream>::operator&
                ((RefCntAutoPtr<Diligent::IFileStream> *)&pFileData);
      ppIVar8 = Diligent::RefCntAutoPtr::DoublePtrHelper::operator_cast_to_IFileStream__
                          ((DoublePtrHelper *)&pFileData);
      (*(pIVar1->super_IObject)._vptr_IObject[4])(pIVar1,uVar7,ppIVar8);
      RefCntAutoPtr<Diligent::IFileStream>::DoublePtrHelper<Diligent::IFileStream>::~DoublePtrHelper
                ((DoublePtrHelper<Diligent::IFileStream> *)&pFileData);
      pIVar9 = Diligent::RefCntAutoPtr::operator_cast_to_IFileStream_((RefCntAutoPtr *)&local_70);
      if (pIVar9 == (IFileStream *)0x0) {
        LogError<false,char[36],std::__cxx11::string,char[29]>
                  (false,"LoadSource",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/DXCompiler.cpp"
                   ,0xd4,(char (*) [36])"Failed to open shader include file ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                   (char (*) [29])0xc39653);
        this_local._4_4_ = -0x7fffbffb;
        pSourceStream.m_pObject._4_4_ = 1;
      }
      else {
        DataBlobImpl::Create((DataBlobImpl *)&pSourceBlob,0,(void *)0x0);
        pIVar9 = RefCntAutoPtr<Diligent::IFileStream>::operator->(&local_70);
        pDVar10 = Diligent::RefCntAutoPtr::operator_cast_to_DataBlobImpl_
                            ((RefCntAutoPtr *)&pSourceBlob);
        (*(pIVar9->super_IObject)._vptr_IObject[5])(pIVar9,pDVar10);
        CComPtr<IDxcBlobEncoding>::CComPtr((CComPtr<IDxcBlobEncoding> *)&stack0xffffffffffffff70);
        pIVar11 = CComPtrBase<IDxcLibrary>::operator->
                            (&(this->m_pdxcLibrary).super_CComPtrBase<IDxcLibrary>);
        pDVar10 = RefCntAutoPtr<Diligent::DataBlobImpl>::operator->
                            ((RefCntAutoPtr<Diligent::DataBlobImpl> *)&pSourceBlob);
        pvVar12 = DataBlobImpl::GetDataPtr(pDVar10,0);
        pDVar10 = RefCntAutoPtr<Diligent::DataBlobImpl>::operator->
                            ((RefCntAutoPtr<Diligent::DataBlobImpl> *)&pSourceBlob);
        sVar13 = DataBlobImpl::GetSize(pDVar10);
        Args_2 = (char (*) [2])
                 CComPtrBase<IDxcBlobEncoding>::operator&
                           ((CComPtrBase<IDxcBlobEncoding> *)&stack0xffffffffffffff70);
        _msg.field_2._12_4_ =
             (**(code **)(*(long *)pIVar11 + 0x30))(pIVar11,pvVar12,sVar13 & 0xffffffff,0xfde9);
        if ((int)_msg.field_2._12_4_ < 0) {
          FormatString<char[50],std::__cxx11::string,char[2]>
                    ((string *)local_b8,
                     (Diligent *)"Failed to allocate space for shader include file ",
                     (char (*) [50])local_48,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xcca6b6,
                     Args_2);
          puVar3 = DebugMessageCallback;
          if (DebugMessageCallback != (undefined *)0x0) {
            uVar7 = std::__cxx11::string::c_str();
            (*(code *)puVar3)(2,uVar7,0);
          }
          std::__cxx11::string::~string((string *)local_b8);
          this_local._4_4_ = -0x7fffbffb;
        }
        else {
          std::
          vector<Diligent::RefCntAutoPtr<Diligent::IDataBlob>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IDataBlob>>>
          ::emplace_back<Diligent::RefCntAutoPtr<Diligent::DataBlobImpl>>
                    ((vector<Diligent::RefCntAutoPtr<Diligent::IDataBlob>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IDataBlob>>>
                      *)&this->m_FileDataCache,(RefCntAutoPtr<Diligent::DataBlobImpl> *)&pSourceBlob
                    );
          pIVar14 = CComPtrBase<IDxcBlobEncoding>::operator->
                              ((CComPtrBase<IDxcBlobEncoding> *)&stack0xffffffffffffff70);
          ppvVar15 = IID_PPV_ARGS_Helper<IDxcBlob>((IDxcBlob **)fileName.field_2._8_8_);
          (*(code *)**(undefined8 **)pIVar14)
                    (pIVar14,_GUID_8ba5fb08_5195_40e2_ac58_0d989c3a0102,ppvVar15);
          this_local._4_4_ = 0;
        }
        pSourceStream.m_pObject._4_4_ = 1;
        CComPtr<IDxcBlobEncoding>::~CComPtr((CComPtr<IDxcBlobEncoding> *)&stack0xffffffffffffff70);
        RefCntAutoPtr<Diligent::DataBlobImpl>::~RefCntAutoPtr
                  ((RefCntAutoPtr<Diligent::DataBlobImpl> *)&pSourceBlob);
      }
      RefCntAutoPtr<Diligent::IFileStream>::~RefCntAutoPtr(&local_70);
    }
    else {
      LogError<false,char[44],std::__cxx11::string,char[32]>
                (false,"LoadSource",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/DXCompiler.cpp"
                 ,200,(char (*) [44])"Failed to convert shader include file name ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 (char (*) [32])". File name must be ANSI string");
      this_local._4_4_ = -0x7fffbffb;
      pSourceStream.m_pObject._4_4_ = 1;
    }
    std::__cxx11::string::~string((string *)local_48);
    return this_local._4_4_;
  }
  return -0x7ff8ffa9;
}

Assistant:

LoadSource(_In_ LPCWSTR pFilename, _COM_Outptr_result_maybenull_ IDxcBlob** ppIncludeSource) override
    {
        if (pFilename == nullptr)
            return E_INVALIDARG;


        if (ppIncludeSource == nullptr)
            return E_INVALIDARG;

        *ppIncludeSource = nullptr;

        String fileName;
        fileName.resize(wcslen(pFilename));
        for (size_t i = 0; i < fileName.size(); ++i)
        {
            fileName[i] = static_cast<char>(pFilename[i]);
        }

        if (fileName.empty())
        {
            LOG_ERROR("Failed to convert shader include file name ", fileName, ". File name must be ANSI string");
            return E_FAIL;
        }

        // validate file name
        if (fileName.size() > 2 && fileName[0] == '.' && (fileName[1] == '\\' || fileName[1] == '/'))
            fileName.erase(0, 2);

        RefCntAutoPtr<IFileStream> pSourceStream;
        m_pStreamFactory->CreateInputStream(fileName.c_str(), &pSourceStream);
        if (pSourceStream == nullptr)
        {
            LOG_ERROR("Failed to open shader include file ", fileName, ". Check that the file exists");
            return E_FAIL;
        }

        RefCntAutoPtr<DataBlobImpl> pFileData = DataBlobImpl::Create();
        pSourceStream->ReadBlob(pFileData);

        CComPtr<IDxcBlobEncoding> pSourceBlob;

        HRESULT hr = m_pdxcLibrary->CreateBlobWithEncodingFromPinned(pFileData->GetDataPtr(), static_cast<UINT32>(pFileData->GetSize()), CP_UTF8, &pSourceBlob);
        if (FAILED(hr))
        {
            LOG_ERROR_MESSAGE("Failed to allocate space for shader include file ", fileName, ".");
            return E_FAIL;
        }

        m_FileDataCache.emplace_back(std::move(pFileData));

        pSourceBlob->QueryInterface(IID_PPV_ARGS(ppIncludeSource));
        return S_OK;
    }